

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr10r1100sixx.cpp
# Opt level: O1

CheckValue<double> IKatan2WithCheck<double>(double fy,double fx,double epsilon)

{
  undefined8 extraout_RAX;
  CheckValue<double> CVar1;
  
  if ((!NAN(fy) && !NAN(fx)) && ((1e-07 <= ABS(fy) || (1e-07 < ABS(fx))))) {
    CVar1.value = atan2(fy,fx);
    CVar1._9_7_ = (undefined7)((ulong)extraout_RAX >> 8);
    CVar1.valid = true;
    return CVar1;
  }
  return (CheckValue<double>)(ZEXT816(0) << 0x40);
}

Assistant:

inline CheckValue<T> IKatan2WithCheck(T fy, T fx, T epsilon)
{
    CheckValue<T> ret;
    ret.valid = false;
    ret.value = 0;
    if( !isnan(fy) && !isnan(fx) ) {
        if( IKabs(fy) >= IKFAST_ATAN2_MAGTHRESH || IKabs(fx) > IKFAST_ATAN2_MAGTHRESH ) {
            ret.value = IKatan2Simple(fy,fx);
            ret.valid = true;
        }
    }
    return ret;
}